

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O3

double Exponential(double dMean,long nStream)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  dVar5 = 0.0;
  if (0.0 < dMean) {
    lVar4 = 0;
    if ((ulong)nStream < 0x32) {
      lVar4 = nStream;
    }
    lVar1 = (Seed[lVar4].value % 0x1f31d) * 0x41a7;
    lVar3 = (Seed[lVar4].value / 0x1f31d) * -0xb14;
    lVar2 = lVar1 + lVar3;
    lVar1 = lVar1 + lVar3 + 0x7fffffff;
    if (-1 < lVar2) {
      lVar1 = lVar2;
    }
    Seed[lVar4].value = lVar1;
    dVar5 = log((double)lVar1 / -2147483647.0 + 1.0);
    dVar5 = dVar5 * -dMean;
  }
  return dVar5;
}

Assistant:

double
Exponential(double dMean, long nStream)

/*
 * Returns a double uniformly distributed with mean dMean.  
 * 0.0 is returned iff dMean <= 0.0. nStream is the random number 
 * stream. Stream 0 is used if nStream is not in the range 
 * 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dMean <= 0.0)
        return (0.0);

    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = (double) Seed[nStream].value / dM;        /* unif between 0..1 */
    return (-dMean * log(1.0 - dTemp));
}